

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::ResonanceRange::
print<std::back_insert_iterator<std::__cxx11::string>>
          (ResonanceRange *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  int iVar1;
  int iVar2;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_60 [48];
  
  local_78 = *(undefined8 *)this;
  uStack_70 = *(undefined8 *)(this + 8);
  local_84 = MT;
  local_80 = MF;
  local_7c = MAT;
  iVar1 = Type<2,_151>::ResonanceRange::LRU((ResonanceRange *)this);
  iVar2 = Type<2,_151>::ResonanceRange::LRF((ResonanceRange *)this);
  local_60._16_8_ = SEXT48(iVar2);
  local_60._8_8_ = ZEXT18((byte)this[0x118]);
  local_60._0_8_ = SEXT48(*(int *)(this + 0x10));
  local_60._40_4_ = (int)local_78;
  local_60._32_8_ = uStack_70;
  local_60._44_4_ = (int)((ulong)local_78 >> 0x20);
  local_60._24_8_ = (long)iVar1;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  if (this[0x118] == (ResonanceRange)0x1) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TabulationRecord *)(this + 0x88),it,MAT,MF,MT);
  }
  local_60._8_8_ = &local_7c;
  local_60._16_8_ = &local_80;
  local_60._24_8_ = &local_84;
  local_60._0_8_ = it;
  std::
  visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
            ((anon_class_32_4_f17ee1e6 *)local_60,
             (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
              *)(this + 0x18));
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->EL(), this->EH(),
                 this->LRU(), this->LRF(),
                 this->NRO(), this->NAPS() ).print( it, MAT, MF, MT );
  if ( this->NRO() ) { this->scattering_radius_->print( it, MAT, MF, MT ); }
  std::visit( [&] ( const auto& v ) -> void
                  { return v.print( it, MAT, MF, MT ); },
              this->parameters_ );
}